

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cc
# Opt level: O2

int __thiscall
cnn::SimpleRNNBuilder::copy(SimpleRNNBuilder *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  size_t i;
  ulong uVar4;
  long lVar5;
  
  lVar3 = *(long *)(dst + 0x28);
  lVar1 = *(long *)(dst + 0x30);
  if ((long)(this->params).
            super__Vector_base<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->params).
            super__Vector_base<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == lVar1 - lVar3) {
    lVar5 = 0;
    uVar4 = 0;
    while( true ) {
      uVar2 = (lVar1 - lVar3) / 0x18;
      if (uVar2 <= uVar4) break;
      Parameters::copy((Parameters *)
                       **(undefined8 **)
                         ((long)&(((this->params).
                                   super__Vector_base<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
                                 )._M_impl.super__Vector_impl_data + lVar5),
                       (EVP_PKEY_CTX *)**(undefined8 **)(lVar3 + lVar5),
                       (EVP_PKEY_CTX *)((lVar1 - lVar3) % 0x18));
      Parameters::copy(*(Parameters **)
                        (*(long *)((long)&(((this->params).
                                            super__Vector_base<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
                                          )._M_impl.super__Vector_impl_data + lVar5) + 8),
                       *(EVP_PKEY_CTX **)(*(long *)(*(long *)(dst + 0x28) + lVar5) + 8),src_00);
      Parameters::copy(*(Parameters **)
                        (*(long *)((long)&(((this->params).
                                            super__Vector_base<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
                                          )._M_impl.super__Vector_impl_data + lVar5) + 0x10),
                       *(EVP_PKEY_CTX **)(*(long *)(*(long *)(dst + 0x28) + lVar5) + 0x10),src_01);
      lVar3 = *(long *)(dst + 0x28);
      lVar1 = *(long *)(dst + 0x30);
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x18;
    }
    return (int)uVar2;
  }
  __assert_fail("params.size() == rnn_simple.params.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/rnn.cc"
                ,0x72,"virtual void cnn::SimpleRNNBuilder::copy(const RNNBuilder &)");
}

Assistant:

void SimpleRNNBuilder::copy(const RNNBuilder & rnn) {
  const SimpleRNNBuilder & rnn_simple = (const SimpleRNNBuilder&)rnn;
  assert(params.size() == rnn_simple.params.size());
  for(size_t i = 0; i < rnn_simple.params.size(); ++i) {
      params[i][0]->copy(*rnn_simple.params[i][0]);
      params[i][1]->copy(*rnn_simple.params[i][1]);
      params[i][2]->copy(*rnn_simple.params[i][2]);
  }
}